

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

TransactionController * __thiscall
cfd::api::TransactionApi::FundRawTransaction
          (TransactionApi *this,string *tx_hex,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos,Amount *target_value,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *selected_txin_utxos,
          string *reserve_txout_address,double effective_fee_rate,Amount *estimate_fee,
          UtxoFilter *filter,CoinSelectionOption *option_params,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *append_txout_addresses,NetType_conflict net_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list,Amount *calculate_fee)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  Transaction *utxo_fee_value;
  uint64_t uVar5;
  char *pcVar6;
  string *txout_fee;
  uint8_t *__src;
  uchar *puVar7;
  size_type sVar8;
  _Base_ptr in_RCX;
  undefined1 uVar9;
  TransactionController *in_RDI;
  int64_t *in_R8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_R9;
  Amount AVar10;
  int64_t *in_stack_00000010;
  undefined4 *in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000038;
  int64_t *in_stack_00000040;
  Utxo *utxo_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range2_3;
  UtxoData *utxo_2;
  iterator __end5;
  iterator __begin5;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range5;
  Utxo *coin;
  iterator __end4;
  iterator __begin4;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range4;
  Txid txid;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> new_selected_utxos;
  TransactionController txc_dummy;
  Amount check_amount;
  Amount need_amount;
  int64_t new_txout_satoshi;
  Amount new_txout_amount;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_bytes;
  Amount dust_amount;
  CoinSelection coin_select;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> selected_coins;
  Amount txin_total_amount;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxo_list;
  Amount target_amount;
  Amount diff_amount;
  Amount fee;
  TxInReference *txin_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *__range3_1;
  bool isFind;
  UtxoData *utxo_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2_2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxodata_list;
  TxInReference *txin;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *__range3;
  UtxoData *utxo;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2_1;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *txin_list;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> matched_txin_utxos;
  TxOutReference *txout;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *__range2;
  Amount txout_amount;
  Amount txin_amount;
  Transaction *tx;
  Address reserve_address;
  AddressFactory_conflict addr_factory;
  UtxoFilter utxo_filter;
  CoinSelectionOption option;
  TransactionController *txc;
  AbstractTxInReference *in_stack_fffffffffffff2c8;
  Address *in_stack_fffffffffffff2d0;
  value_type *in_stack_fffffffffffff2d8;
  TransactionController *in_stack_fffffffffffff2e0;
  size_type in_stack_fffffffffffff2e8;
  CfdError CVar11;
  uint32_t uVar12;
  CfdException *in_stack_fffffffffffff2f0;
  Txid *txid_00;
  TransactionController *this_00;
  undefined6 in_stack_fffffffffffff308;
  undefined1 in_stack_fffffffffffff30e;
  undefined1 in_stack_fffffffffffff30f;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffff310;
  undefined7 in_stack_fffffffffffff318;
  undefined1 in_stack_fffffffffffff31f;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffff320;
  Amount *in_stack_fffffffffffff348;
  Address *in_stack_fffffffffffff350;
  undefined7 in_stack_fffffffffffff358;
  undefined1 in_stack_fffffffffffff35f;
  NetType in_stack_fffffffffffff38c;
  Address *in_stack_fffffffffffff390;
  undefined7 in_stack_fffffffffffff398;
  undefined1 in_stack_fffffffffffff39f;
  Address *in_stack_fffffffffffff408;
  undefined7 in_stack_fffffffffffff410;
  undefined1 in_stack_fffffffffffff417;
  CoinSelectionOption *in_stack_fffffffffffff430;
  undefined7 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4af;
  UtxoFilter *in_stack_fffffffffffff4b0;
  uint in_stack_fffffffffffff4b8;
  uint32_t in_stack_fffffffffffff4bc;
  uint32_t in_stack_fffffffffffff4c0;
  undefined2 in_stack_fffffffffffff4c4;
  undefined1 in_stack_fffffffffffff4c6;
  undefined1 in_stack_fffffffffffff4c7;
  CoinSelection *this_01;
  undefined7 in_stack_fffffffffffff4e0;
  undefined1 in_stack_fffffffffffff4e7;
  Amount *in_stack_fffffffffffff4e8;
  bool *in_stack_fffffffffffff4f8;
  ByteData256 local_ad0;
  Txid local_ab8 [5];
  reference local_a08;
  Utxo *local_a00;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_9f8;
  undefined1 *local_9f0;
  int64_t local_9e8;
  char *local_9e0;
  undefined4 local_9d8;
  char *local_9d0;
  char *local_978;
  undefined4 local_970;
  char *local_968;
  pointer local_960;
  undefined1 local_958;
  pointer local_950;
  undefined1 local_948;
  undefined1 local_93a;
  allocator local_939;
  string local_938 [32];
  CfdSourceLocation local_918;
  Amount *local_900;
  undefined1 local_8f8;
  Address *local_8f0;
  char *local_8e8;
  undefined4 local_8e0;
  char *local_8d8;
  pointer local_8d0;
  undefined1 local_8c8;
  string local_8c0 [32];
  pointer local_8a0;
  undefined1 local_898;
  reference local_840;
  UtxoData *local_838;
  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_830;
  undefined1 *local_828;
  ByteData256 local_820;
  Txid local_808;
  reference local_7e8;
  Utxo *local_7e0;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_7d8;
  undefined1 *local_7d0;
  Txid local_7c8 [4];
  int64_t local_740;
  undefined1 local_738;
  Amount local_730;
  int64_t local_720;
  undefined1 local_718;
  Amount local_710;
  int64_t local_700;
  int64_t local_6f8;
  undefined1 local_6f0;
  Amount local_6e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_6d0 [24];
  void *local_6b8;
  pointer local_6b0;
  undefined4 in_stack_fffffffffffff958;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff95c;
  Amount *in_stack_fffffffffffff960;
  Amount *in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff971;
  string *in_stack_fffffffffffff978;
  string *tx_hex_00;
  bool in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff981;
  allocator local_671;
  string local_670 [32];
  CfdSourceLocation local_650;
  int64_t local_638;
  char *local_630;
  undefined4 local_628;
  char *local_620;
  int64_t local_618;
  undefined1 local_610;
  undefined1 local_608 [128];
  undefined1 local_588 [48];
  pointer local_558;
  undefined1 local_550;
  pointer local_548;
  undefined1 local_540;
  pointer local_538;
  undefined1 local_530;
  pointer local_528;
  undefined1 local_520;
  pointer local_518;
  undefined1 local_510;
  pointer local_508;
  undefined1 local_500;
  undefined1 local_4f8 [24];
  Amount local_4e0;
  pointer local_4d0;
  pointer local_4c8;
  undefined1 local_4c0 [16];
  pointer local_4b0;
  undefined1 local_4a8;
  pointer local_4a0;
  undefined1 local_498;
  undefined1 local_490 [16];
  Txid local_480;
  AbstractTxInReference *local_460;
  pointer local_458;
  __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
  local_450;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *local_448;
  byte local_439;
  reference local_438;
  UtxoData *local_430;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_428;
  _Base_ptr local_420;
  undefined1 local_418 [24];
  UtxoFilter *local_400;
  undefined1 local_3f8;
  Txid local_3f0;
  AbstractTxInReference *local_3d0;
  TxInReference *local_3c8;
  __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
  local_3c0;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *local_3b8;
  reference local_3b0;
  UtxoData *local_3a8;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_3a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_398;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_390;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *local_378;
  CoinSelection local_370;
  undefined1 local_340;
  Amount local_338;
  AbstractTxOutReference *local_328;
  TxOutReference *local_320;
  __normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
  local_318;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_310;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *local_2f8;
  Amount local_2f0;
  undefined1 local_2e0 [16];
  Transaction *local_2d0;
  byte local_2c3;
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [36];
  NetType local_29c;
  char *local_298;
  undefined4 local_290;
  char *local_288;
  Address local_280;
  undefined4 local_a4;
  CoinSelectionOption local_a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_30;
  int64_t *local_28;
  _Base_ptr local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_fffffffffffff2d0);
  if (in_stack_00000018 != (undefined4 *)0x0) {
    local_a4 = *in_stack_00000018;
  }
  if (in_stack_00000020 == 0) {
    CoinSelectionOption::InitializeTxSizeInfo(in_stack_fffffffffffff430);
    CoinSelectionOption::SetEffectiveFeeBaserate
              ((CoinSelectionOption *)in_stack_fffffffffffff2d0,(double)in_stack_fffffffffffff2c8);
    CoinSelectionOption::SetLongTermFeeBaserate
              ((CoinSelectionOption *)in_stack_fffffffffffff2d0,(double)in_stack_fffffffffffff2c8);
  }
  else {
    CoinSelectionOption::operator=
              ((CoinSelectionOption *)in_stack_fffffffffffff2d0,
               (CoinSelectionOption *)in_stack_fffffffffffff2c8);
  }
  AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_fffffffffffff2d0,
             (NetType)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
  if (in_stack_00000038 != 0) {
    AddressFactory::AddressFactory
              ((AddressFactory *)in_stack_fffffffffffff2d0,
               (NetType)((ulong)in_stack_fffffffffffff2c8 >> 0x20),
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x5409ca);
    AddressFactory::operator=
              ((AddressFactory *)in_stack_fffffffffffff2d0,
               (AddressFactory *)in_stack_fffffffffffff2c8);
    AddressFactory::~AddressFactory((AddressFactory *)0x5409f0);
  }
  AddressFactory::GetAddress
            ((AddressFactory *)in_stack_fffffffffffff2d8,(string *)in_stack_fffffffffffff2d0);
  bVar1 = AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398)
                     ,in_stack_fffffffffffff390,in_stack_fffffffffffff38c);
  if (!bVar1) {
    local_298 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                        ,0x2f);
    CVar11 = (CfdError)(in_stack_fffffffffffff2e8 >> 0x20);
    local_298 = local_298 + 1;
    local_290 = 0x146;
    local_288 = "FundRawTransaction";
    local_29c = core::Address::GetNetType(&local_280);
    core::logger::warn<std::__cxx11::string_const&,cfd::core::NetType&,cfd::core::NetType>
              ((CfdSourceLocation *)in_stack_fffffffffffff2e0,(char *)in_stack_fffffffffffff2d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d0,(anon_enum_32 *)in_stack_fffffffffffff2c8,
               (anon_enum_32 *)0x540b1c);
    local_2c2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2c0,"Failed to FundRawTransaction. Input address and network is unmatch.",
               &local_2c1);
    core::CfdException::CfdException
              (in_stack_fffffffffffff2f0,CVar11,(string *)in_stack_fffffffffffff2e0);
    local_2c2 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_2c3 = 0;
  TransactionController::TransactionController
            (in_stack_fffffffffffff2e0,(string *)in_stack_fffffffffffff2d8);
  utxo_fee_value = TransactionController::GetTransaction(in_RDI);
  local_2d0 = utxo_fee_value;
  core::Amount::Amount((Amount *)local_2e0);
  core::Amount::Amount(&local_2f0);
  core::Transaction::GetTxOutList(&local_310,local_2d0);
  local_2f8 = &local_310;
  local_318._M_current =
       (TxOutReference *)
       std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::begin
                 (local_2f8);
  local_320 = (TxOutReference *)
              std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
              end(local_2f8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                             *)in_stack_fffffffffffff2d0,
                            (__normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                             *)in_stack_fffffffffffff2c8), bVar1) {
    local_328 = &__gnu_cxx::
                 __normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                 ::operator*(&local_318)->super_AbstractTxOutReference;
    AVar10 = core::AbstractTxOutReference::GetValue(local_328);
    in_stack_fffffffffffff4e8 = (Amount *)AVar10.amount_;
    in_stack_fffffffffffff4e7 = AVar10.ignore_check_;
    local_370.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)in_stack_fffffffffffff4e8;
    local_340 = in_stack_fffffffffffff4e7;
    local_338.amount_ = (int64_t)in_stack_fffffffffffff4e8;
    local_338.ignore_check_ = (bool)in_stack_fffffffffffff4e7;
    AVar10 = core::Amount::operator+=(&local_2f0,&local_338);
    local_370.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)AVar10.amount_;
    local_370.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset._0_1_ =
         AVar10.ignore_check_;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
    ::operator++(&local_318);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             in_stack_fffffffffffff2e0);
  this_01 = &local_370;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x540e23);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(local_30);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::reserve
            (in_stack_fffffffffffff310,
             CONCAT17(in_stack_fffffffffffff30f,
                      CONCAT16(in_stack_fffffffffffff30e,in_stack_fffffffffffff308)));
  core::Transaction::GetTxInList(&local_390,local_2d0);
  local_378 = &local_390;
  local_398 = local_30;
  local_3a0._M_current =
       (UtxoData *)
       std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                 ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff2c8
                 );
  local_3a8 = (UtxoData *)
              std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                        ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                         in_stack_fffffffffffff2c8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                        *)in_stack_fffffffffffff2d0,
                       (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                        *)in_stack_fffffffffffff2c8);
    if (!bVar1) {
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
                ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x5410f9);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size
                ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)local_20);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::reserve
                (in_stack_fffffffffffff310,
                 CONCAT17(in_stack_fffffffffffff30f,
                          CONCAT16(in_stack_fffffffffffff30e,in_stack_fffffffffffff308)));
      local_420 = local_20;
      local_428._M_current =
           (UtxoData *)
           std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                     ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                      in_stack_fffffffffffff2c8);
      local_430 = (UtxoData *)
                  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                             in_stack_fffffffffffff2c8);
      do {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                            *)in_stack_fffffffffffff2d0,
                           (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                            *)in_stack_fffffffffffff2c8);
        if (!bVar1) {
          core::Amount::Amount((Amount *)local_490);
          uVar5 = CoinSelectionOption::GetEffectiveFeeBaserate(&local_a0);
          if (uVar5 != 0) {
            AVar10 = EstimateFee((TransactionApi *)
                                 CONCAT71(in_stack_fffffffffffff981,in_stack_fffffffffffff980),
                                 in_stack_fffffffffffff978,
                                 (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                                 CONCAT71(in_stack_fffffffffffff971,in_stack_fffffffffffff970),
                                 in_stack_fffffffffffff968,in_stack_fffffffffffff960,
                                 (double)CONCAT44(in_stack_fffffffffffff95c,
                                                  in_stack_fffffffffffff958));
            local_4b0 = (pointer)AVar10.amount_;
            local_4a8 = AVar10.ignore_check_;
            local_4a0 = local_4b0;
            local_498 = local_4a8;
            local_490._0_8_ = local_4b0;
            local_490[8] = (bool)local_4a8;
            pcVar6 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                             ,0x2f);
            local_4c8 = (pointer)(pcVar6 + 1);
            local_4c0._0_4_ = 0x17d;
            local_4c0._8_8_ = "FundRawTransaction";
            local_4d0 = (pointer)core::Amount::GetSatoshiValue((Amount *)local_490);
            core::logger::info<long>
                      ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                       (char *)in_stack_fffffffffffff2c8,(long *)0x541492);
          }
          core::Amount::Amount(&local_4e0);
          local_4f8._0_8_ = *local_28;
          local_4f8._8_8_ = local_28[1];
          bVar1 = core::operator>((Amount *)local_2e0,&local_2f0);
          if (bVar1) {
            AVar10 = core::operator-((Amount *)local_2e0,&local_2f0);
            local_518 = (pointer)AVar10.amount_;
            local_510 = AVar10.ignore_check_;
            local_508 = local_518;
            local_500 = local_510;
            local_4e0.amount_ = (int64_t)local_518;
            local_4e0.ignore_check_ = (bool)local_510;
            bVar1 = core::operator<(&local_4e0,(Amount *)local_4f8);
            if (bVar1) {
              AVar10 = core::Amount::operator-=((Amount *)local_4f8,&local_4e0);
              local_528 = (pointer)AVar10.amount_;
              local_520 = AVar10.ignore_check_;
            }
          }
          else {
            bVar1 = core::operator<((Amount *)local_2e0,&local_2f0);
            if (bVar1) {
              AVar10 = core::operator-(&local_2f0,(Amount *)local_2e0);
              local_548 = (pointer)AVar10.amount_;
              local_540 = AVar10.ignore_check_;
              local_538 = local_548;
              local_530 = local_540;
              local_4e0.amount_ = (int64_t)local_548;
              local_4e0.ignore_check_ = (bool)local_540;
              AVar10 = core::Amount::operator+=((Amount *)local_4f8,&local_4e0);
              local_558 = (pointer)AVar10.amount_;
              local_550 = AVar10.ignore_check_;
            }
          }
          UtxoUtil::ConvertToUtxo
                    ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     CONCAT17(in_stack_fffffffffffff31f,in_stack_fffffffffffff318));
          local_588._0_8_ = local_2e0._0_8_;
          local_588._8_8_ = local_2e0._8_8_;
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x541702);
          bVar1 = core::operator>((Amount *)local_4f8,0);
          if ((bVar1) || (bVar1 = core::operator>((Amount *)local_490,0), bVar1)) {
            pcVar6 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                             ,0x2f);
            local_608._80_8_ = pcVar6 + 1;
            local_608._88_4_ = 0x197;
            local_608._96_8_ = "FundRawTransaction";
            local_608._72_8_ = core::Amount::GetSatoshiValue((Amount *)local_4f8);
            core::logger::info<long>
                      ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                       (char *)in_stack_fffffffffffff2c8,(long *)0x5417cc);
            CoinSelection::CoinSelection((CoinSelection *)0x5417db);
            in_stack_fffffffffffff2d0 = (Address *)local_588;
            in_stack_fffffffffffff2c8 = (AbstractTxInReference *)local_490;
            in_stack_fffffffffffff2e0 = (TransactionController *)0x0;
            in_stack_fffffffffffff2d8 = (value_type *)0x0;
            CoinSelection::SelectCoins
                      (this_01,(Amount *)
                               CONCAT17(in_stack_fffffffffffff4c7,
                                        CONCAT16(in_stack_fffffffffffff4c6,
                                                 CONCAT24(in_stack_fffffffffffff4c4,
                                                          in_stack_fffffffffffff4c0))),
                       (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                       CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                       in_stack_fffffffffffff4b0,
                       (CoinSelectionOption *)
                       CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8),
                       (Amount *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                       in_stack_fffffffffffff4e8,(Amount *)utxo_fee_value,in_stack_fffffffffffff4f8)
            ;
            in_stack_fffffffffffff408 = (Address *)local_608;
            std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                      ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff2e0,
                       (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff2d8);
            std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                      ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff2e0);
            AVar10 = core::Amount::operator+=((Amount *)local_588,(Amount *)local_2e0);
            local_618 = AVar10.amount_;
            in_stack_fffffffffffff417 = AVar10.ignore_check_;
            local_610 = in_stack_fffffffffffff417;
            local_630 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                                ,0x2f);
            local_630 = local_630 + 1;
            local_628 = 0x19f;
            local_620 = "FundRawTransaction";
            local_638 = core::Amount::GetSatoshiValue((Amount *)local_588);
            core::logger::info<long>
                      ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                       (char *)in_stack_fffffffffffff2c8,(long *)0x541925);
            bVar1 = core::operator<((Amount *)local_588,(Amount *)local_4f8);
            if (bVar1) {
              local_650.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                           ,0x2f);
              CVar11 = (CfdError)(in_stack_fffffffffffff2e8 >> 0x20);
              local_650.filename = local_650.filename + 1;
              local_650.line = 0x1a2;
              local_650.funcname = "FundRawTransaction";
              core::logger::warn<>(&local_650,"Failed to FundRawTransaction. low BTC.");
              uVar4 = __cxa_allocate_exception(0x30);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_670,"low BTC.",&local_671);
              core::CfdException::CfdException
                        (in_stack_fffffffffffff2f0,CVar11,(string *)in_stack_fffffffffffff2e0);
              __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            CoinSelection::~CoinSelection((CoinSelection *)0x541acd);
          }
          AVar10 = CoinSelectionOption::GetDustFeeAmount
                             ((CoinSelectionOption *)
                              CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                              in_stack_fffffffffffff408);
          txout_fee = (string *)AVar10.amount_;
          uVar9 = AVar10.ignore_check_;
          tx_hex_00 = txout_fee;
          bVar1 = (bool)uVar9;
          pcVar6 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                           ,0x2f);
          local_6b0 = (pointer)(pcVar6 + 1);
          uVar13 = 0x1aa;
          pcVar6 = "FundRawTransaction";
          local_6b8 = (void *)core::Amount::GetSatoshiValue((Amount *)&stack0xfffffffffffff978);
          core::logger::info<long>
                    ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                     (char *)in_stack_fffffffffffff2c8,(long *)0x541bbc);
          std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x541bd3);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,
                     (allocator_type *)in_stack_fffffffffffff2e0);
          std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x541bfc);
          AVar10 = core::operator-((Amount *)local_588,&local_2f0);
          local_6f8 = AVar10.amount_;
          local_6f0 = AVar10.ignore_check_;
          local_6e8.amount_ = local_6f8;
          local_6e8.ignore_check_ = (bool)local_6f0;
          local_700 = core::Amount::GetSatoshiValue(&local_6e8);
          uVar5 = CoinSelectionOption::GetEffectiveFeeBaserate(&local_a0);
          if (uVar5 != 0) {
            AVar10 = core::operator+(&local_2f0,(Amount *)local_490);
            local_720 = AVar10.amount_;
            local_718 = AVar10.ignore_check_;
            local_710.amount_ = local_720;
            local_710.ignore_check_ = (bool)local_718;
            AVar10 = core::operator-((Amount *)local_588,(Amount *)&stack0xfffffffffffff978);
            local_740 = AVar10.amount_;
            local_738 = AVar10.ignore_check_;
            local_730.amount_ = local_740;
            local_730.ignore_check_ = (bool)local_738;
            bVar2 = core::operator>(&local_730,&local_710);
            CVar11 = (CfdError)(in_stack_fffffffffffff2e8 >> 0x20);
            if (bVar2) {
              TransactionController::TransactionController
                        (in_stack_fffffffffffff2e0,(string *)in_stack_fffffffffffff2d8);
              std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
                        (in_stack_fffffffffffff320,
                         (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                         CONCAT17(in_stack_fffffffffffff31f,in_stack_fffffffffffff318));
              core::Txid::Txid(local_7c8);
              local_7d0 = local_608 + 0x68;
              local_7d8._M_current =
                   (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                                     ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                                      in_stack_fffffffffffff2c8);
              local_7e0 = (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end
                                            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                                             in_stack_fffffffffffff2c8);
              while( true ) {
                bVar2 = __gnu_cxx::operator!=
                                  ((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                                    *)in_stack_fffffffffffff2d0,
                                   (__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                                    *)in_stack_fffffffffffff2c8);
                CVar11 = (CfdError)(in_stack_fffffffffffff2e8 >> 0x20);
                if (!bVar2) break;
                local_7e8 = __gnu_cxx::
                            __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                            ::operator*(&local_7d8);
                puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    0x541e5f);
                __src = local_7e8->txid;
                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_6d0);
                memcpy(puVar7,__src,sVar8);
                core::ByteData256::ByteData256
                          (&local_820,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6d0);
                core::Txid::Txid(&local_808,&local_820);
                core::Txid::operator=(local_7c8,&local_808);
                core::Txid::~Txid((Txid *)0x541ef2);
                core::ByteData256::~ByteData256((ByteData256 *)0x541eff);
                local_828 = local_418;
                local_830._M_current =
                     (UtxoData *)
                     std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                               ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                                in_stack_fffffffffffff2c8);
                local_838 = (UtxoData *)
                            std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                                      ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                                       in_stack_fffffffffffff2c8);
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                                           *)in_stack_fffffffffffff2d0,
                                          (__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                                           *)in_stack_fffffffffffff2c8), bVar2) {
                  local_840 = __gnu_cxx::
                              __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                              ::operator*(&local_830);
                  bVar2 = core::Txid::Equals(local_7c8,&local_840->txid);
                  if ((bVar2) && (local_7e8->vout == local_840->vout)) {
                    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                               in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
                    break;
                  }
                  __gnu_cxx::
                  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                  ::operator++(&local_830);
                }
                __gnu_cxx::
                __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                ::operator++(&local_7d8);
              }
              TransactionController::AddTxOut
                        ((TransactionController *)
                         CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
                         in_stack_fffffffffffff350,in_stack_fffffffffffff348);
              core::TxOutReference::~TxOutReference((TxOutReference *)0x542105);
              AbstractTransactionController::GetHex_abi_cxx11_
                        ((AbstractTransactionController *)in_stack_fffffffffffff2c8);
              AVar10 = EstimateFee((TransactionApi *)CONCAT71(in_stack_fffffffffffff981,bVar1),
                                   tx_hex_00,
                                   (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                                   CONCAT71(in_stack_fffffffffffff971,uVar9),(Amount *)txout_fee,
                                   (Amount *)pcVar6,
                                   (double)CONCAT44(in_stack_fffffffffffff95c,uVar13));
              local_8d0 = (pointer)AVar10.amount_;
              in_stack_fffffffffffff35f = AVar10.ignore_check_;
              local_8c8 = in_stack_fffffffffffff35f;
              local_8a0 = local_8d0;
              local_898 = in_stack_fffffffffffff35f;
              local_490._0_8_ = local_8d0;
              local_490[8] = (bool)in_stack_fffffffffffff35f;
              std::__cxx11::string::~string(local_8c0);
              local_8e8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                                  ,0x2f);
              local_8e8 = local_8e8 + 1;
              local_8e0 = 0x1cc;
              local_8d8 = "FundRawTransaction";
              in_stack_fffffffffffff350 =
                   (Address *)core::Amount::GetSatoshiValue((Amount *)local_490);
              local_8f0 = in_stack_fffffffffffff350;
              core::logger::info<long>
                        ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                         (char *)in_stack_fffffffffffff2c8,(long *)0x54223b);
              core::Txid::~Txid((Txid *)0x54224a);
              std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
                        ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                         in_stack_fffffffffffff2e0);
              TransactionController::~TransactionController
                        ((TransactionController *)in_stack_fffffffffffff2d0);
            }
            AVar10 = core::Amount::operator-=(&local_6e8,(Amount *)local_490);
            in_stack_fffffffffffff348 = (Amount *)AVar10.amount_;
            local_8f8 = AVar10.ignore_check_;
            local_900 = in_stack_fffffffffffff348;
            local_700 = core::Amount::GetSatoshiValue(&local_6e8);
            bVar1 = core::operator<((Amount *)local_588,&local_6e8);
            if (bVar1) {
              local_918.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                           ,0x2f);
              local_918.filename = local_918.filename + 1;
              local_918.line = 0x1d4;
              local_918.funcname = "FundRawTransaction";
              core::logger::warn<>(&local_918,"Failed to FundRawTransaction. low fee.");
              local_93a = 1;
              uVar4 = __cxa_allocate_exception(0x30);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_938,"Failed to FundRawTransaction. low fee.",&local_939);
              core::CfdException::CfdException
                        (in_stack_fffffffffffff2f0,CVar11,(string *)in_stack_fffffffffffff2e0);
              local_93a = 0;
              __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            if (in_stack_00000040 != (int64_t *)0x0) {
              *in_stack_00000040 = local_490._0_8_;
              *(bool *)(in_stack_00000040 + 1) = local_490[8];
            }
            bVar1 = core::operator>((Amount *)&stack0xfffffffffffff978,&local_6e8);
            if (bVar1) {
              local_700 = 0;
              AVar10 = core::operator-((Amount *)local_588,&local_6e8);
              local_960 = (pointer)AVar10.amount_;
              local_958 = AVar10.ignore_check_;
              local_950 = local_960;
              local_948 = local_958;
              local_490._0_8_ = local_960;
              local_490[8] = (bool)local_958;
            }
            local_978 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                                ,0x2f);
            local_978 = local_978 + 1;
            local_970 = 0x1e2;
            local_968 = "FundRawTransaction";
            core::logger::info<long&>
                      ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                       (char *)in_stack_fffffffffffff2c8,(long *)0x542589);
          }
          if ((local_700 != 0) &&
             (bVar1 = core::operator<((Amount *)&stack0xfffffffffffff978,&local_6e8), bVar1)) {
            TransactionController::AddTxOut
                      ((TransactionController *)
                       CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
                       in_stack_fffffffffffff350,in_stack_fffffffffffff348);
            core::TxOutReference::~TxOutReference((TxOutReference *)0x5425f8);
            local_9e0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                                ,0x2f);
            local_9e0 = local_9e0 + 1;
            local_9d8 = 0x1eb;
            local_9d0 = "FundRawTransaction";
            local_9e8 = core::Amount::GetSatoshiValue(&local_4e0);
            core::logger::info<long>
                      ((CfdSourceLocation *)in_stack_fffffffffffff2d0,
                       (char *)in_stack_fffffffffffff2c8,(long *)0x54266b);
            if (in_stack_00000028 != 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff2e0,(value_type *)in_stack_fffffffffffff2d8);
            }
          }
          if (in_stack_00000010 != (int64_t *)0x0) {
            *in_stack_00000010 = local_490._0_8_;
            *(bool *)(in_stack_00000010 + 1) = local_490[8];
          }
          local_9f0 = local_608 + 0x68;
          local_9f8._M_current =
               (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                                 ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                                  in_stack_fffffffffffff2c8);
          local_a00 = (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end
                                        ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                                         in_stack_fffffffffffff2c8);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                                     *)in_stack_fffffffffffff2d0,
                                    (__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                                     *)in_stack_fffffffffffff2c8), bVar1) {
            local_a08 = __gnu_cxx::
                        __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                        ::operator*(&local_9f8);
            this_00 = (TransactionController *)local_6d0;
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x54273a);
            txid_00 = (Txid *)local_a08->txid;
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
            memcpy(puVar7,txid_00,sVar8);
            uVar12 = (uint32_t)((ulong)puVar7 >> 0x20);
            core::ByteData256::ByteData256
                      (&local_ad0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
            core::Txid::Txid(local_ab8,&local_ad0);
            TransactionController::AddTxIn(this_00,txid_00,uVar12);
            core::TxInReference::~TxInReference((TxInReference *)0x5427ce);
            core::Txid::~Txid((Txid *)0x5427db);
            core::ByteData256::~ByteData256((ByteData256 *)0x5427e8);
            __gnu_cxx::
            __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
            operator++(&local_9f8);
          }
          local_2c3 = 1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff2e0);
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff2e0);
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff2e0);
          std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
                    ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     in_stack_fffffffffffff2e0);
          std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                    ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                     in_stack_fffffffffffff2e0);
          std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
                    ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     in_stack_fffffffffffff2e0);
          if ((local_2c3 & 1) == 0) {
            TransactionController::~TransactionController
                      ((TransactionController *)in_stack_fffffffffffff2d0);
          }
          core::Address::~Address(in_stack_fffffffffffff2d0);
          AddressFactory::~AddressFactory((AddressFactory *)0x542919);
          CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x542926);
          return in_RDI;
        }
        local_438 = __gnu_cxx::
                    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                    ::operator*(&local_428);
        local_439 = 0;
        local_448 = local_378;
        local_450._M_current =
             (TxInReference *)
             std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::begin
                       (local_378);
        local_458 = (pointer)std::
                             vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                             ::end(local_448);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                                   *)in_stack_fffffffffffff2d0,
                                  (__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                                   *)in_stack_fffffffffffff2c8), bVar1) {
          local_460 = &__gnu_cxx::
                       __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                       ::operator*(&local_450)->super_AbstractTxInReference;
          core::AbstractTxInReference::GetTxid(in_stack_fffffffffffff2c8);
          bVar2 = core::Txid::Equals(&local_480,&local_438->txid);
          bVar1 = false;
          if (bVar2) {
            uVar12 = local_438->vout;
            uVar3 = core::AbstractTxInReference::GetVout(local_460);
            bVar1 = uVar12 == uVar3;
          }
          core::Txid::~Txid((Txid *)0x5412a7);
          if (bVar1) {
            local_439 = 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
          ::operator++(&local_450);
        }
        if ((local_439 & 1) == 0) {
          std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                    ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
        ::operator++(&local_428);
      } while( true );
    }
    local_3b0 = __gnu_cxx::
                __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                ::operator*(&local_3a0);
    local_3b8 = local_378;
    local_3c0._M_current =
         (TxInReference *)
         std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::begin
                   (local_378);
    local_3c8 = (TxInReference *)
                std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
                end(local_3b8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                               *)in_stack_fffffffffffff2d0,
                              (__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                               *)in_stack_fffffffffffff2c8), bVar1) {
      local_3d0 = &__gnu_cxx::
                   __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                   ::operator*(&local_3c0)->super_AbstractTxInReference;
      core::AbstractTxInReference::GetTxid(in_stack_fffffffffffff2c8);
      in_stack_fffffffffffff4c7 = core::Txid::Equals(&local_3f0,&local_3b0->txid);
      in_stack_fffffffffffff4c6 = false;
      if ((bool)in_stack_fffffffffffff4c7) {
        in_stack_fffffffffffff4bc = local_3b0->vout;
        in_stack_fffffffffffff4c0 = core::AbstractTxInReference::GetVout(local_3d0);
        in_stack_fffffffffffff4c6 = in_stack_fffffffffffff4bc == in_stack_fffffffffffff4c0;
      }
      in_stack_fffffffffffff4b8 =
           CONCAT13(in_stack_fffffffffffff4c6,(int3)in_stack_fffffffffffff4b8);
      core::Txid::~Txid((Txid *)0x540ff0);
      if ((in_stack_fffffffffffff4b8 & 0x1000000) != 0) {
        AVar10 = core::Amount::operator+=((Amount *)local_2e0,&local_3b0->amount);
        in_stack_fffffffffffff4b0 = (UtxoFilter *)AVar10.amount_;
        in_stack_fffffffffffff4af = AVar10.ignore_check_;
        local_400 = in_stack_fffffffffffff4b0;
        local_3f8 = in_stack_fffffffffffff4af;
        std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                  ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                   in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
      ::operator++(&local_3c0);
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++(&local_3a0);
  } while( true );
}

Assistant:

TransactionController TransactionApi::FundRawTransaction(
    const std::string& tx_hex, const std::vector<UtxoData>& utxos,
    const Amount& target_value,
    const std::vector<UtxoData>& selected_txin_utxos,
    const std::string& reserve_txout_address, double effective_fee_rate,
    Amount* estimate_fee, const UtxoFilter* filter,
    const CoinSelectionOption* option_params,
    std::vector<std::string>* append_txout_addresses, NetType net_type,
    const std::vector<AddressFormatData>* prefix_list,
    Amount* calculate_fee) const {
  // set option
  CoinSelectionOption option;
  UtxoFilter utxo_filter;
  if (filter) utxo_filter = *filter;
  if (option_params) {
    option = *option_params;
  } else {
    option.InitializeTxSizeInfo();
    option.SetEffectiveFeeBaserate(effective_fee_rate);
    option.SetLongTermFeeBaserate(effective_fee_rate);
  }

  AddressFactory addr_factory(net_type);
  if (prefix_list) {
    addr_factory = AddressFactory(net_type, *prefix_list);
  }
  Address reserve_address = addr_factory.GetAddress(reserve_txout_address);
  // FIXME(fujita-cg): AddressFactory::GetAddress()でチェックをしたいが、
  //   影響範囲が大きいためAPIでチェックを実行
  if (!addr_factory.CheckAddressNetType(reserve_address, net_type)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to FundRawTransaction. "
        "Input address and network is unmatch."
        ": address=[{}], input_net_type=[{}], parsed_net_type=[{}]",
        reserve_txout_address, net_type, reserve_address.GetNetType());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to FundRawTransaction. "
        "Input address and network is unmatch.");
  }

  // txから設定済みTxIn/TxOutの額を収集
  // (selected_txin_utxos指定分はtxid一致なら設定済みUTXO扱い)
  TransactionController txc(tx_hex);
  const Transaction& tx = txc.GetTransaction();
  Amount txin_amount;
  Amount txout_amount;
  for (const auto& txout : tx.GetTxOutList()) {
    txout_amount += txout.GetValue();
  }
  std::vector<UtxoData> matched_txin_utxos;
  matched_txin_utxos.reserve(selected_txin_utxos.size());
  const auto& txin_list = tx.GetTxInList();
  for (const auto& utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(utxo.txid)) &&
          (utxo.vout == txin.GetVout())) {
        txin_amount += utxo.amount;
        matched_txin_utxos.push_back(utxo);
        break;
      }
    }
  }

  std::vector<UtxoData> utxodata_list;
  utxodata_list.reserve(utxos.size());
  for (const auto& utxo : utxos) {
    bool isFind = false;
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(utxo.txid)) &&
          (utxo.vout == txin.GetVout())) {
        isFind = true;
        break;
      }
    }
    if (!isFind) {
      utxodata_list.push_back(utxo);
    }
  }

  Amount fee;
  if (option.GetEffectiveFeeBaserate() != 0) {
    fee = EstimateFee(
        tx_hex, matched_txin_utxos, nullptr, nullptr, effective_fee_rate);
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: pre estimation fee=[{}]",
        fee.GetSatoshiValue());
  }

  Amount diff_amount = Amount();        // difference between input and output
  Amount target_amount = target_value;  // selection require amount
  if (txin_amount > txout_amount) {
    // txinの余剰分を計算
    diff_amount = txin_amount - txout_amount;
    if (diff_amount < target_amount) {
      // txinの余剰分でtarget分が満たされない場合、満たされない分をコインセレクト
      target_amount -= diff_amount;
    }
  } else if (txin_amount < txout_amount) {
    // txoutの不足分を計算
    diff_amount = txout_amount - txin_amount;
    // txoutの不足分を合わせてコインセレクト
    target_amount += diff_amount;
  }

  // execute coinselection
  std::vector<Utxo> utxo_list = UtxoUtil::ConvertToUtxo(utxodata_list);
  Amount txin_total_amount = txin_amount;
  std::vector<Utxo> selected_coins;
  if (target_amount > 0 || fee > 0) {
    info(
        CFD_LOG_SOURCE, "FundRawTransaction:CoinSelection: target_amount=[{}]",
        target_amount.GetSatoshiValue());
    CoinSelection coin_select;
    selected_coins = coin_select.SelectCoins(
        target_amount, utxo_list, utxo_filter, option, fee, &txin_total_amount,
        nullptr, nullptr);
    txin_total_amount += txin_amount;
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: txin_total_amount=[{}]",
        txin_total_amount.GetSatoshiValue());
    if (txin_total_amount < target_amount) {
      warn(CFD_LOG_SOURCE, "Failed to FundRawTransaction. low BTC.");
      throw CfdException(CfdError::kCfdIllegalArgumentError, "low BTC.");
    }
  }

  // dust_amountを計算
  Amount dust_amount = option.GetDustFeeAmount(reserve_address);
  info(
      CFD_LOG_SOURCE, "FundRawTransaction: dust_amount=[{}]",
      dust_amount.GetSatoshiValue());

  // txoutへの追加
  std::vector<uint8_t> txid_bytes(cfd::core::kByteData256Length);
  Amount new_txout_amount =
      txin_total_amount -
      txout_amount;  // diff_amount: selected + txin - txout = new txout amount
  int64_t new_txout_satoshi = new_txout_amount.GetSatoshiValue();
  // feeを考慮する場合、追加後のTxInが既存のTxOut額以上ある場合、TxOutが追加されるのでfeeを再計算
  if (option.GetEffectiveFeeBaserate() > 0) {
    Amount need_amount = txout_amount + fee;
    Amount check_amount = txin_total_amount - dust_amount;
    if (check_amount > need_amount) {
      // dummyのtx作成
      TransactionController txc_dummy(tx_hex);
      std::vector<UtxoData> new_selected_utxos = matched_txin_utxos;
      Txid txid;
      for (const Utxo& coin : selected_coins) {
        memcpy(txid_bytes.data(), coin.txid, txid_bytes.size());
        txid = Txid(ByteData256(txid_bytes));
        for (const UtxoData& utxo : utxodata_list) {
          if (txid.Equals(utxo.txid) && (coin.vout == utxo.vout)) {
            new_selected_utxos.push_back(utxo);
            break;
          }
        }
      }
      // ダミーへの追加のため額はfeeで代替
      txc_dummy.AddTxOut(reserve_address, fee);
      fee = EstimateFee(
          txc_dummy.GetHex(), new_selected_utxos, nullptr, nullptr,
          effective_fee_rate);
      info(
          CFD_LOG_SOURCE, "FundRawTransaction: new_fee={}",
          fee.GetSatoshiValue());
    }

    new_txout_amount -= fee;  // txoutの追加額からfee分を除外
    new_txout_satoshi = new_txout_amount.GetSatoshiValue();

    if (txin_total_amount < new_txout_amount) {
      warn(CFD_LOG_SOURCE, "Failed to FundRawTransaction. low fee.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to FundRawTransaction. low fee.");
    }

    if (calculate_fee != nullptr) *calculate_fee = fee;
    // optionで、超過額の設定がある場合、余剰分をfeeに設定。
    if (dust_amount > new_txout_amount) {
      // feeに残高をすべて設定
      new_txout_satoshi = 0;
      fee = txin_total_amount - new_txout_amount;
    }
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: new_txout_amount={}",
        new_txout_satoshi);
  }

  // dustより小さい場合はTxOutには追加しない
  // (fee計算ありの場合はチェック済だが、fee計算なしの場合は未チェックのため)
  if ((new_txout_satoshi != 0) && (dust_amount < new_txout_amount)) {
    txc.AddTxOut(reserve_address, new_txout_amount);
    info(
        CFD_LOG_SOURCE, "FundRawTransaction:AddTxOut: value=[{}]",
        diff_amount.GetSatoshiValue());
    if (append_txout_addresses) {
      append_txout_addresses->push_back(reserve_txout_address);
    }
  }
  if (estimate_fee) *estimate_fee = fee;

  // SelectしたUTXOをTxInに設定
  for (auto& utxo : selected_coins) {
    memcpy(txid_bytes.data(), utxo.txid, txid_bytes.size());
    txc.AddTxIn(Txid(ByteData256(txid_bytes)), utxo.vout);
  }

  return txc;
}